

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_yplus_lengthscale2
          (REF_GRID ref_grid,REF_DBL mach,REF_DBL re,REF_DBL reference_t_k,REF_INT ldim,
          REF_DBL *field,REF_DBL *lengthscale)

{
  REF_NODE ref_node_00;
  REF_CELL pRVar1;
  REF_CELL pRVar2;
  REF_INT RVar3;
  uint uVar4;
  REF_STATUS RVar5;
  int iVar6;
  REF_DBL *to_scalar;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_450;
  REF_DBL local_440;
  double local_438;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_DBL press;
  REF_DBL gamma;
  REF_DBL yplus_dist;
  REF_DBL t;
  REF_DBL rho;
  REF_DBL tangent [3];
  double local_3b8;
  REF_DBL edg_norm_1 [3];
  REF_DBL dxyz_1 [3];
  REF_DBL u1;
  REF_DBL u0;
  REF_DBL du;
  REF_DBL dn_1;
  REF_INT on_node_1;
  REF_INT off_node_1;
  REF_INT tri_list_1 [2];
  REF_INT ntri_1;
  REF_INT tri_nodes_1 [27];
  int local_2d4;
  REF_INT edg_nodes_1 [27];
  int local_25c;
  REF_INT tri_1;
  REF_INT edg_1;
  REF_CELL tri_cell_1;
  REF_CELL edg_cell_1;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_INTERP ref_interp;
  long lStack_228;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  uint local_210;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_GLOB global;
  REF_DBL edg_norm [3];
  REF_DBL dxyz [3];
  REF_DBL dn;
  REF_INT new_node;
  REF_INT on_node;
  REF_INT off_node;
  REF_INT tri_list [2];
  REF_INT ntri;
  REF_INT tri_nodes [27];
  int local_114;
  REF_INT edg_nodes [27];
  REF_INT ixyz;
  REF_INT tri;
  REF_INT edg;
  REF_CELL tri_cell;
  REF_CELL edg_cell;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL stretch;
  REF_DBL *exchange_field;
  REF_NODE exchange_node;
  REF_GRID exchange_grid;
  void *pvStack_58;
  REF_INT node;
  REF_INT *hits;
  REF_NODE ref_node;
  REF_DBL *lengthscale_local;
  REF_DBL *field_local;
  REF_DBL RStack_30;
  REF_INT ldim_local;
  REF_DBL reference_t_k_local;
  REF_DBL re_local;
  REF_DBL mach_local;
  REF_GRID ref_grid_local;
  
  hits = &ref_grid->node->n;
  ref_node = (REF_NODE)lengthscale;
  lengthscale_local = field;
  field_local._4_4_ = ldim;
  RStack_30 = reference_t_k;
  reference_t_k_local = re;
  re_local = mach;
  mach_local = (REF_DBL)ref_grid;
  if (ref_grid->twod == 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x34c,
           "ref_phys_yplus_lengthscale2",6,"implement 3D");
    ref_grid_local._4_4_ = 6;
  }
  else {
    uVar4 = ref_grid_create((REF_GRID_conflict *)&exchange_node,ref_grid->mpi);
    if (uVar4 == 0) {
      ref_node_00 = *(REF_NODE *)&exchange_node->blank;
      for (exchange_grid._4_4_ = 0; exchange_grid._4_4_ < hits[1];
          exchange_grid._4_4_ = exchange_grid._4_4_ + 1) {
        if (((-1 < exchange_grid._4_4_) && (exchange_grid._4_4_ < hits[1])) &&
           (-1 < *(long *)(*(long *)(hits + 4) + (long)exchange_grid._4_4_ * 8))) {
          *(undefined8 *)(&ref_node->n + (long)exchange_grid._4_4_ * 2) = 0;
        }
      }
      if (hits[1] < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x352,"ref_phys_yplus_lengthscale2","malloc hits of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        pvStack_58 = malloc((long)hits[1] << 2);
        if (pvStack_58 == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x352,"ref_phys_yplus_lengthscale2","malloc hits of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (edg_cell._4_4_ = 0; edg_cell._4_4_ < hits[1]; edg_cell._4_4_ = edg_cell._4_4_ + 1) {
            *(undefined4 *)((long)pvStack_58 + (long)edg_cell._4_4_ * 4) = 0;
          }
          uVar4 = ref_node_initialize_n_global(ref_node_00,0);
          if (uVar4 == 0) {
            pRVar1 = *(REF_CELL *)((long)mach_local + 0x10);
            pRVar2 = *(REF_CELL *)((long)mach_local + 0x28);
            for (ixyz = 0; ixyz < pRVar1->max; ixyz = ixyz + 1) {
              RVar5 = ref_cell_nodes(pRVar1,ixyz,tri_nodes + 0x1a);
              if (RVar5 == 0) {
                ref_private_status_reis_ai._4_4_ =
                     ref_layer_interior_seg_normal((REF_GRID)mach_local,ixyz,(REF_DBL *)&global);
                if (ref_private_status_reis_ai._4_4_ != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x361,"ref_phys_yplus_lengthscale2",
                         (ulong)ref_private_status_reis_ai._4_4_,"edge norm");
                  return ref_private_status_reis_ai._4_4_;
                }
                ref_private_status_reis_ai._0_4_ =
                     ref_cell_list_with2(*(REF_CELL *)((long)mach_local + 0x28),tri_nodes[0x1a],
                                         local_114,2,tri_list,&on_node);
                if ((uint)ref_private_status_reis_ai != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x364,"ref_phys_yplus_lengthscale2",
                         (ulong)(uint)ref_private_status_reis_ai,"tri with2");
                  return (uint)ref_private_status_reis_ai;
                }
                ref_private_status_reis_bi = 1;
                _ref_private_macro_code_rss_6 = (long)tri_list[0];
                if (_ref_private_macro_code_rss_6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x365,"ref_phys_yplus_lengthscale2","edg expects one tri",1,
                         _ref_private_macro_code_rss_6);
                  return 1;
                }
                ref_private_macro_code_rss_7 = ref_cell_nodes(pRVar2,on_node,tri_list + 1);
                if (ref_private_macro_code_rss_7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x367,"ref_phys_yplus_lengthscale2",
                         (ulong)(uint)ref_private_macro_code_rss_7,"tri nodes");
                  return ref_private_macro_code_rss_7;
                }
                dn._4_4_ = tri_nodes[0x1a];
                new_node = ((tri_list[1] + ntri + tri_nodes[0]) - tri_nodes[0x1a]) - local_114;
                dVar7 = *(double *)(*(long *)(hits + 0xe) + (long)(new_node * 0xf) * 8) -
                        *(double *)(*(long *)(hits + 0xe) + (long)(tri_nodes[0x1a] * 0xf) * 8);
                dVar8 = *(double *)(*(long *)(hits + 0xe) + (long)(new_node * 0xf + 1) * 8) -
                        *(double *)(*(long *)(hits + 0xe) + (long)(tri_nodes[0x1a] * 0xf + 1) * 8);
                dVar9 = *(double *)(*(long *)(hits + 0xe) + (long)(new_node * 0xf + 2) * 8) -
                        *(double *)(*(long *)(hits + 0xe) + (long)(tri_nodes[0x1a] * 0xf + 2) * 8);
                if (dVar9 * edg_norm[1] + dVar7 * (double)global + dVar8 * edg_norm[0] <= 0.0) {
                  local_438 = -(dVar9 * edg_norm[1] + dVar7 * (double)global + dVar8 * edg_norm[0]);
                }
                else {
                  local_438 = dVar9 * edg_norm[1] + dVar7 * (double)global + dVar8 * edg_norm[0];
                }
                local_210 = ref_node_next_global
                                      (ref_node_00,(REF_GLOB *)&ref_private_macro_code_rss_4);
                if (local_210 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x372,"ref_phys_yplus_lengthscale2",(ulong)local_210,"next");
                  return local_210;
                }
                ref_private_status_reis_ai_1._4_4_ =
                     ref_node_add(ref_node_00,_ref_private_macro_code_rss_4,(REF_INT *)&dn);
                if (ref_private_status_reis_ai_1._4_4_ != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x373,"ref_phys_yplus_lengthscale2",
                         (ulong)ref_private_status_reis_ai_1._4_4_,"add node");
                  return ref_private_status_reis_ai_1._4_4_;
                }
                ref_private_status_reis_bi_1 = (REF_LONG)ixyz;
                lStack_228 = (long)dn._0_4_;
                if (ref_private_status_reis_bi_1 != lStack_228) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x374,"ref_phys_yplus_lengthscale2","expects new node to match edg",
                         ref_private_status_reis_bi_1,lStack_228);
                  return 1;
                }
                for (edg_nodes[0x19] = 0; edg_nodes[0x19] < 3; edg_nodes[0x19] = edg_nodes[0x19] + 1
                    ) {
                  ref_node_00->real[edg_nodes[0x19] + dn._0_4_ * 0xf] =
                       (*(double *)
                         (*(long *)(hits + 0xe) +
                         (long)(edg_nodes[0x19] + tri_nodes[0x1a] * 0xf) * 8) +
                       *(double *)
                        (*(long *)(hits + 0xe) + (long)(edg_nodes[0x19] + local_114 * 0xf) * 8)) *
                       0.5 + local_438 * 2.0 * edg_norm[(long)edg_nodes[0x19] + -1];
                }
                ref_private_status_reis_ai_1._4_4_ = 0;
              }
            }
            ref_interp._4_4_ = ref_node_synchronize_globals(ref_node_00);
            if (ref_interp._4_4_ == 0) {
              if (field_local._4_4_ * ref_node_00->max < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x37e,"ref_phys_yplus_lengthscale2",
                       "malloc exchange_field of REF_DBL negative");
                ref_grid_local._4_4_ = 1;
              }
              else {
                to_scalar = (REF_DBL *)malloc((long)(field_local._4_4_ * ref_node_00->max) << 3);
                if (to_scalar == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x37e,"ref_phys_yplus_lengthscale2",
                         "malloc exchange_field of REF_DBL NULL");
                  ref_grid_local._4_4_ = 2;
                }
                else {
                  uVar4 = ref_interp_create((REF_INTERP *)&ref_private_macro_code_rss_10,
                                            (REF_GRID)mach_local,(REF_GRID)exchange_node);
                  if (uVar4 == 0) {
                    uVar4 = ref_interp_locate(_ref_private_macro_code_rss_10);
                    if (uVar4 == 0) {
                      uVar4 = ref_interp_scalar(_ref_private_macro_code_rss_10,field_local._4_4_,
                                                lengthscale_local,to_scalar);
                      if (uVar4 == 0) {
                        if (*(int *)((long)mach_local + 0x108) == 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x3bd,"ref_phys_yplus_lengthscale2",6,"implement 3D");
                          ref_grid_local._4_4_ = 6;
                        }
                        else {
                          pRVar1 = *(REF_CELL *)((long)mach_local + 0x10);
                          pRVar2 = *(REF_CELL *)((long)mach_local + 0x28);
                          for (local_25c = 0; local_25c < pRVar1->max; local_25c = local_25c + 1) {
                            RVar5 = ref_cell_nodes(pRVar1,local_25c,tri_nodes_1 + 0x1a);
                            if (RVar5 == 0) {
                              uVar4 = ref_layer_interior_seg_normal
                                                ((REF_GRID)mach_local,local_25c,&local_3b8);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x394,"ref_phys_yplus_lengthscale2",(ulong)uVar4,"edge norm"
                                      );
                                return uVar4;
                              }
                              uVar4 = ref_cell_list_with2(*(REF_CELL *)((long)mach_local + 0x28),
                                                          tri_nodes_1[0x1a],local_2d4,2,tri_list_1,
                                                          &on_node_1);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x397,"ref_phys_yplus_lengthscale2",(ulong)uVar4,"tri with2"
                                      );
                                return uVar4;
                              }
                              if ((long)tri_list_1[0] != 1) {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x398,"ref_phys_yplus_lengthscale2","edg expects one tri",1,
                                       (long)tri_list_1[0]);
                                return 1;
                              }
                              uVar4 = ref_cell_nodes(pRVar2,on_node_1,tri_list_1 + 1);
                              RVar3 = tri_nodes_1[0x1a];
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x39a,"ref_phys_yplus_lengthscale2",(ulong)uVar4,"tri nodes"
                                      );
                                return uVar4;
                              }
                              iVar6 = ((tri_list_1[1] + ntri_1 + tri_nodes_1[0]) - tri_nodes_1[0x1a]
                                      ) - local_2d4;
                              rho = *(double *)(*(long *)(hits + 0xe) + (long)(local_2d4 * 0xf) * 8)
                                    - *(double *)
                                       (*(long *)(hits + 0xe) + (long)(tri_nodes_1[0x1a] * 0xf) * 8)
                              ;
                              tangent[0] = *(double *)
                                            (*(long *)(hits + 0xe) + (long)(local_2d4 * 0xf + 1) * 8
                                            ) - *(double *)
                                                 (*(long *)(hits + 0xe) +
                                                 (long)(tri_nodes_1[0x1a] * 0xf + 1) * 8);
                              tangent[1] = *(double *)
                                            (*(long *)(hits + 0xe) + (long)(local_2d4 * 0xf + 2) * 8
                                            ) - *(double *)
                                                 (*(long *)(hits + 0xe) +
                                                 (long)(tri_nodes_1[0x1a] * 0xf + 2) * 8);
                              uVar4 = ref_math_normalize(&rho);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x3a4,"ref_phys_yplus_lengthscale2",(ulong)uVar4,
                                       "normalize tangent");
                                return uVar4;
                              }
                              local_440 = to_scalar[(long)(field_local._4_4_ * local_25c + 1) + 2] *
                                          tangent[1] +
                                          to_scalar[field_local._4_4_ * local_25c + 1] * rho +
                                          to_scalar[(long)(field_local._4_4_ * local_25c + 1) + 1] *
                                          tangent[0];
                              dVar7 = *(double *)(*(long *)(hits + 0xe) + (long)(iVar6 * 0xf) * 8) -
                                      *(double *)(*(long *)(hits + 0xe) + (long)(RVar3 * 0xf) * 8);
                              dVar8 = *(double *)
                                       (*(long *)(hits + 0xe) + (long)(iVar6 * 0xf + 1) * 8) -
                                      *(double *)
                                       (*(long *)(hits + 0xe) + (long)(RVar3 * 0xf + 1) * 8);
                              dVar9 = *(double *)
                                       (*(long *)(hits + 0xe) + (long)(iVar6 * 0xf + 2) * 8) -
                                      *(double *)
                                       (*(long *)(hits + 0xe) + (long)(RVar3 * 0xf + 2) * 8);
                              if (0.0 - local_440 <= 0.0) {
                                local_440 = -(0.0 - local_440);
                              }
                              else {
                                local_440 = 0.0 - local_440;
                              }
                              if (dVar9 * edg_norm_1[1] + dVar7 * local_3b8 + dVar8 * edg_norm_1[0]
                                  <= 0.0) {
                                local_450 = -(dVar9 * edg_norm_1[1] +
                                             dVar7 * local_3b8 + dVar8 * edg_norm_1[0]);
                              }
                              else {
                                local_450 = dVar9 * edg_norm_1[1] +
                                            dVar7 * local_3b8 + dVar8 * edg_norm_1[0];
                              }
                              t = lengthscale_local[field_local._4_4_ * RVar3];
                              yplus_dist = (lengthscale_local[field_local._4_4_ * RVar3 + 4] / t) *
                                           1.4;
                              uVar4 = ref_phys_yplus_dist(re_local,reference_t_k_local,RStack_30,t,
                                                          yplus_dist,local_450 * 2.0,local_440,
                                                          &gamma);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x3b6,"ref_phys_yplus_lengthscale2",(ulong)uVar4,
                                       "yplus dist");
                                return uVar4;
                              }
                              *(double *)(&ref_node->n + (long)tri_nodes_1[0x1a] * 2) =
                                   gamma + *(double *)(&ref_node->n + (long)tri_nodes_1[0x1a] * 2);
                              *(int *)((long)pvStack_58 + (long)tri_nodes_1[0x1a] * 4) =
                                   *(int *)((long)pvStack_58 + (long)tri_nodes_1[0x1a] * 4) + 1;
                              *(double *)(&ref_node->n + (long)local_2d4 * 2) =
                                   gamma + *(double *)(&ref_node->n + (long)local_2d4 * 2);
                              *(int *)((long)pvStack_58 + (long)local_2d4 * 4) =
                                   *(int *)((long)pvStack_58 + (long)local_2d4 * 4) + 1;
                            }
                          }
                          for (exchange_grid._4_4_ = 0; exchange_grid._4_4_ < hits[1];
                              exchange_grid._4_4_ = exchange_grid._4_4_ + 1) {
                            if (((-1 < exchange_grid._4_4_) && (exchange_grid._4_4_ < hits[1])) &&
                               ((-1 < *(long *)(*(long *)(hits + 4) + (long)exchange_grid._4_4_ * 8)
                                && (0 < *(int *)((long)pvStack_58 + (long)exchange_grid._4_4_ * 4)))
                               )) {
                              *(double *)(&ref_node->n + (long)exchange_grid._4_4_ * 2) =
                                   *(double *)(&ref_node->n + (long)exchange_grid._4_4_ * 2) /
                                   (double)*(int *)((long)pvStack_58 + (long)exchange_grid._4_4_ * 4
                                                   );
                            }
                          }
                          if (pvStack_58 != (void *)0x0) {
                            free(pvStack_58);
                          }
                          uVar4 = ref_node_ghost_dbl((REF_NODE)hits,(REF_DBL *)ref_node,1);
                          if (uVar4 == 0) {
                            if (to_scalar != (REF_DBL *)0x0) {
                              free(to_scalar);
                            }
                            ref_grid_local._4_4_ = ref_grid_free((REF_GRID_conflict)exchange_node);
                            if (ref_grid_local._4_4_ == 0) {
                              ref_grid_local._4_4_ = 0;
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                     ,0x3c9,"ref_phys_yplus_lengthscale2",
                                     (ulong)ref_grid_local._4_4_,"free");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                   ,0x3c6,"ref_phys_yplus_lengthscale2",(ulong)uVar4,
                                   "ghost lengthscale");
                            ref_grid_local._4_4_ = uVar4;
                          }
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x385,"ref_phys_yplus_lengthscale2",(ulong)uVar4,"interp scalar");
                        ref_grid_local._4_4_ = uVar4;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                             ,899,"ref_phys_yplus_lengthscale2",(ulong)uVar4,"nearest");
                      ref_grid_local._4_4_ = uVar4;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x382,"ref_phys_yplus_lengthscale2",(ulong)uVar4,"make interp");
                    ref_grid_local._4_4_ = uVar4;
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x37d,"ref_phys_yplus_lengthscale2",(ulong)ref_interp._4_4_,"sync global");
              ref_grid_local._4_4_ = ref_interp._4_4_;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x354,"ref_phys_yplus_lengthscale2",(ulong)uVar4,"init nnodesg");
            ref_grid_local._4_4_ = uVar4;
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x34f,
             "ref_phys_yplus_lengthscale2",(ulong)uVar4,"create exchange");
      ref_grid_local._4_4_ = uVar4;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_lengthscale2(REF_GRID ref_grid, REF_DBL mach,
                                               REF_DBL re,
                                               REF_DBL reference_t_k,
                                               REF_INT ldim, REF_DBL *field,
                                               REF_DBL *lengthscale) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  REF_GRID exchange_grid;
  REF_NODE exchange_node;
  REF_DBL *exchange_field;
  REF_DBL stretch = 2.0;
  if (!ref_grid_twod(ref_grid)) RSS(REF_IMPLEMENT, "implement 3D");

  RSS(ref_grid_create(&exchange_grid, ref_grid_mpi(ref_grid)),
      "create exchange");
  exchange_node = ref_grid_node(exchange_grid);
  each_ref_node_valid_node(ref_node, node) { lengthscale[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);

  RSS(ref_node_initialize_n_global(exchange_node, 0), "init nnodesg");

  {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri, ixyz;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node, new_node;
    REF_DBL dn, dxyz[3], edg_norm[3];
    REF_GLOB global;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      dn = ABS(ref_math_dot(dxyz, edg_norm));
      RSS(ref_node_next_global(exchange_node, &global), "next");
      RSS(ref_node_add(exchange_node, global, &new_node), "add node");
      REIS(edg, new_node, "expects new node to match edg");
      for (ixyz = 0; ixyz < 3; ixyz++) {
        ref_node_xyz(exchange_node, ixyz, new_node) =
            0.5 * (ref_node_xyz(ref_node, ixyz, edg_nodes[0]) +
                   ref_node_xyz(ref_node, ixyz, edg_nodes[1])) +
            stretch * dn * edg_norm[ixyz];
      }
    }
  }
  RSS(ref_node_synchronize_globals(exchange_node), "sync global");
  ref_malloc(exchange_field, ldim * ref_node_max(exchange_node), REF_DBL);

  {
    REF_INTERP ref_interp;
    RSS(ref_interp_create(&ref_interp, ref_grid, exchange_grid), "make interp");
    RSS(ref_interp_locate(ref_interp), "nearest");
    RSS(ref_interp_scalar(ref_interp, ldim, field, exchange_field),
        "interp scalar");
  }

  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, du, u0, u1, dxyz[3], edg_norm[3], tangent[3];
    REF_DBL rho, t, yplus_dist;
    REF_DBL gamma = 1.4, press;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      tangent[0] = ref_node_xyz(ref_node, 0, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 0, edg_nodes[0]);
      tangent[1] = ref_node_xyz(ref_node, 1, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 1, edg_nodes[0]);
      tangent[2] = ref_node_xyz(ref_node, 2, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 2, edg_nodes[0]);
      RSS(ref_math_normalize(tangent), "normalize tangent");

      u0 = ref_math_dot(&(field[1 + ldim * on_node]), tangent);
      u1 = ref_math_dot(&(exchange_field[1 + ldim * edg]), tangent);
      u0 = 0.0; /* assume no-slip bc */
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      du = ABS(u0 - u1);
      dn = stretch * ABS(ref_math_dot(dxyz, edg_norm));
      rho = field[0 + ldim * on_node];
      press = field[4 + ldim * on_node];
      t = gamma * (press / rho);
      RSS(ref_phys_yplus_dist(mach, re, reference_t_k, rho, t, dn, du,
                              &yplus_dist),
          "yplus dist");
      lengthscale[edg_nodes[0]] += yplus_dist;
      hits[edg_nodes[0]] += 1;
      lengthscale[edg_nodes[1]] += yplus_dist;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      lengthscale[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, lengthscale, 1), "ghost lengthscale");

  ref_free(exchange_field);
  RSS(ref_grid_free(exchange_grid), "free");

  return REF_SUCCESS;
}